

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O2

void __thiscall ear::Channel::Channel(Channel *this,Channel *param_1)

{
  double dVar1;
  undefined8 uVar2;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  (this->_polarPosition).distance = (param_1->_polarPosition).distance;
  dVar1 = (param_1->_polarPosition).elevation;
  (this->_polarPosition).azimuth = (param_1->_polarPosition).azimuth;
  (this->_polarPosition).elevation = dVar1;
  (this->_polarPositionNominal).super_type.m_initialized = false;
  if ((param_1->_polarPositionNominal).super_type.m_initialized == true) {
    *(undefined8 *)((long)&(this->_polarPositionNominal).super_type.m_storage.dummy_ + 0x10) =
         *(undefined8 *)((long)&(param_1->_polarPositionNominal).super_type.m_storage.dummy_ + 0x10)
    ;
    uVar2 = *(undefined8 *)((long)&(param_1->_polarPositionNominal).super_type.m_storage.dummy_ + 8)
    ;
    (this->_polarPositionNominal).super_type.m_storage.dummy_.aligner_ =
         (param_1->_polarPositionNominal).super_type.m_storage.dummy_.aligner_;
    *(undefined8 *)((long)&(this->_polarPositionNominal).super_type.m_storage.dummy_ + 8) = uVar2;
    (this->_polarPositionNominal).super_type.m_initialized = true;
  }
  (this->_azimuthRange).super_type.m_initialized = false;
  if ((param_1->_azimuthRange).super_type.m_initialized == true) {
    uVar2 = *(undefined8 *)((long)&(param_1->_azimuthRange).super_type.m_storage.dummy_ + 8);
    (this->_azimuthRange).super_type.m_storage.dummy_.aligner_ =
         (param_1->_azimuthRange).super_type.m_storage.dummy_.aligner_;
    *(undefined8 *)((long)&(this->_azimuthRange).super_type.m_storage.dummy_ + 8) = uVar2;
    (this->_azimuthRange).super_type.m_initialized = true;
  }
  (this->_elevationRange).super_type.m_initialized = false;
  if ((param_1->_elevationRange).super_type.m_initialized == true) {
    uVar2 = *(undefined8 *)((long)&(param_1->_elevationRange).super_type.m_storage.dummy_ + 8);
    (this->_elevationRange).super_type.m_storage.dummy_.aligner_ =
         (param_1->_elevationRange).super_type.m_storage.dummy_.aligner_;
    *(undefined8 *)((long)&(this->_elevationRange).super_type.m_storage.dummy_ + 8) = uVar2;
    (this->_elevationRange).super_type.m_initialized = true;
  }
  this->_isLfe = param_1->_isLfe;
  return;
}

Assistant:

class EAR_EXPORT Channel {
   public:
    Channel() = default;
    /**
     * @param name Channel name.
     * @param polarPosition  real speaker location
     * @param polarPositionNominal nominal speaker location, defaults to
     *     polar_position
     * @param azimuthRange
     *     azimuth range in degrees; allowed range is interpreted as
     *     starting at azimuthRange[0], moving anticlockwise to azimuthRange[1];
     *     defaults to the azimuth of polar_nominal_position.
     * @param elevationRange
     *     elevation range in degrees; allowed range is interpreted as
     *     starting at elevationRange.first, moving up to elevationRange.second
     *     defaults to the elevation of polar_nominal_position.
     * @param isLfe flag to indicate an LFE channel
     */
    Channel(
        const std::string& name, PolarPosition polarPosition,
        boost::optional<PolarPosition> polarPositionNominal = boost::none,
        boost::optional<std::pair<double, double>> azimuthRange = boost::none,
        boost::optional<std::pair<double, double>> elevationRange = boost::none,
        bool isLfe = false);

    const std::string& name() const;
    PolarPosition polarPosition() const;
    PolarPosition polarPositionNominal() const;
    std::pair<double, double> azimuthRange() const;
    std::pair<double, double> elevationRange() const;
    bool isLfe() const;

    void name(const std::string& name);
    void polarPosition(PolarPosition polarPosition);
    void polarPositionNominal(
        const boost::optional<PolarPosition>& polarPositionNominal);
    void azimuthRange(
        const boost::optional<std::pair<double, double>>& azimuthRange);
    void elevationRange(
        const boost::optional<std::pair<double, double>>& elevationRange);
    void isLfe(bool isLfe);

    void checkPosition(std::function<void(const std::string&)> callback) const;

   private:
    std::string _name;
    PolarPosition _polarPosition;
    boost::optional<PolarPosition> _polarPositionNominal;
    boost::optional<std::pair<double, double>> _azimuthRange;
    boost::optional<std::pair<double, double>> _elevationRange;
    bool _isLfe;
  }